

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_executor_group.cpp
# Opt level: O2

void __thiscall let::EventExecutor::stop(EventExecutor *this)

{
  std::mutex::lock(&this->mutex_);
  this->is_running_ = false;
  EventLoop::stop((this->event_loop_)._M_t.
                  super___uniq_ptr_impl<let::EventLoop,_std::default_delete<let::EventLoop>_>._M_t.
                  super__Tuple_impl<0UL,_let::EventLoop_*,_std::default_delete<let::EventLoop>_>.
                  super__Head_base<0UL,_let::EventLoop_*,_false>._M_head_impl);
  std::thread::join();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void EventExecutor::stop()
{
    std::lock_guard<std::mutex> lock_guard(mutex_);
    is_running_ = false;
    event_loop_->stop();
    thread_.join();
}